

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O2

timer_id_t __thiscall
so_5::timers_details::
actual_thread_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::schedule(actual_thread_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
           *this,type_index *type_index,mbox_t *mbox,message_ref_t *msg,duration pause,
          duration period)

{
  basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
  *this_00;
  intrusive_ptr_t<so_5::timer_t> iVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_00000008;
  type_info *local_80;
  timer_holder local_78;
  anon_class_24_3_67f5ac77 local_70;
  intrusive_ptr_t<so_5::timer_t> local_58;
  timer_action local_50;
  
  local_70.type_index._M_target = type_index[1]._M_target;
  local_58.m_obj = (timer_t *)this;
  stdcpp::
  make_unique<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>,timertt::timer_heap_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>*>
            ((stdcpp *)&local_80,
             (timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
              **)&local_70);
  this_00 = (basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
             *)type_index[1]._M_target;
  local_78.m_timer = *(timer_object<timertt::thread_safety::safe> **)(local_80 + 0x18);
  if (local_78.m_timer != (timer_object<timertt::thread_safety::safe> *)0x0) {
    LOCK();
    ((local_78.m_timer)->m_references).super___atomic_base<unsigned_int>._M_i =
         ((local_78.m_timer)->m_references).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  local_70.type_index._M_target = (type_info *)mbox->m_obj;
  local_70.mbox.m_obj = (abstract_message_box_t *)msg->m_obj;
  if ((message_t *)local_70.mbox.m_obj != (message_t *)0x0) {
    LOCK();
    (((message_t *)local_70.mbox.m_obj)->super_atomic_refcounted_t).m_ref_counter.
    super___atomic_base<unsigned_long>._M_i =
         (((message_t *)local_70.mbox.m_obj)->super_atomic_refcounted_t).m_ref_counter.
         super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  local_70.msg.m_obj = *(message_t **)pause.__r;
  if (local_70.msg.m_obj != (message_t *)0x0) {
    LOCK();
    ((local_70.msg.m_obj)->super_atomic_refcounted_t).m_ref_counter.
    super___atomic_base<unsigned_long>._M_i =
         ((local_70.msg.m_obj)->super_atomic_refcounted_t).m_ref_counter.
         super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  std::function<void()>::
  function<so_5::timers_details::actual_thread_t<timertt::timer_heap_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>::schedule(std::type_index_const&,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::intrusive_ptr_t<so_5::message_t>const&,std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::_lambda()_1_,void>
            ((function<void()> *)&local_50,&local_70);
  timertt::details::
  basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
  ::
  activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (this_00,&local_78,(duration<long,_std::ratio<1L,_1000000000L>_>)period.__r,
             in_stack_00000008,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  actual_thread_t<timertt::timer_heap_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>
  ::
  schedule(std::type_index_const&,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::intrusive_ptr_t<so_5::message_t>const&,std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>)
  ::{lambda()#1}::~duration((_lambda___1_ *)&local_70);
  timertt::timer_object_holder<timertt::thread_safety::safe>::dismiss_object(&local_78);
  iVar1.m_obj = local_58.m_obj;
  local_70.type_index._M_target = local_80;
  local_80 = (type_info *)0x0;
  if (local_70.type_index._M_target != (type_info *)0x0) {
    LOCK();
    *(long *)(local_70.type_index._M_target + 8) = *(long *)(local_70.type_index._M_target + 8) + 1;
    UNLOCK();
  }
  timer_id_t::timer_id_t((timer_id_t *)local_58.m_obj,(intrusive_ptr_t<so_5::timer_t> *)&local_70);
  intrusive_ptr_t<so_5::timer_t>::~intrusive_ptr_t((intrusive_ptr_t<so_5::timer_t> *)&local_70);
  if (local_80 != (type_info *)0x0) {
    (**(code **)(*(long *)local_80 + 8))();
  }
  return (timer_id_t)(intrusive_ptr_t<so_5::timer_t>)iVar1.m_obj;
}

Assistant:

virtual timer_id_t
		schedule(
			const std::type_index & type_index,
			const mbox_t & mbox,
			const message_ref_t & msg,
			std::chrono::steady_clock::duration pause,
			std::chrono::steady_clock::duration period ) override
			{
				auto timer = stdcpp::make_unique< timer_demand_t >( m_thread.get() );

				m_thread->activate( timer->timer_holder(),
						pause,
						period,
						[type_index, mbox, msg]()
						{
							::so_5::rt::impl::mbox_iface_for_timers_t{ mbox }
									.deliver_message_from_timer( type_index, msg );
						} );

				return timer_id_t( timer.release() );
			}